

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

void BinarySink_put_epoint(BinarySink *bs,EdwardsPoint *point,ec_curve *curve,_Bool bare)

{
  BinarySink *bs_00;
  uint8_t val;
  byte bVar1;
  uint uVar2;
  ulong byte;
  size_t i;
  ulong byte_00;
  mp_int *y;
  mp_int *x;
  mp_int *local_38;
  mp_int *local_30;
  
  ecc_edwards_get_affine(point,&local_30,&local_38);
  if (1 < curve->fieldBytes) {
    if (!bare) {
      BinarySink_put_uint32(bs->binarysink_,curve->fieldBytes);
    }
    byte_00 = 0;
    while( true ) {
      byte = curve->fieldBytes - 1;
      bs_00 = bs->binarysink_;
      if (byte <= byte_00) break;
      val = mp_get_byte(local_38,byte_00);
      BinarySink_put_byte(bs_00,val);
      byte_00 = byte_00 + 1;
    }
    bVar1 = mp_get_byte(local_38,byte);
    uVar2 = mp_get_bit(local_30,0);
    BinarySink_put_byte(bs_00,(char)uVar2 << 7 | bVar1 & 0x7f);
    mp_free(local_30);
    mp_free(local_38);
    return;
  }
  __assert_fail("curve->fieldBytes >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x23e,
                "void BinarySink_put_epoint(BinarySink *, EdwardsPoint *, const struct ec_curve *, _Bool)"
               );
}

Assistant:

static void BinarySink_put_epoint(
    BinarySink *bs, EdwardsPoint *point, const struct ec_curve *curve,
    bool bare)
{
    mp_int *x, *y;
    ecc_edwards_get_affine(point, &x, &y);

    assert(curve->fieldBytes >= 2);

    /*
     * EdDSA requires point compression. We store a single integer,
     * with bytes in little-endian order, which mostly contains y but
     * in which the topmost bit is the low bit of x.
     */
    if (!bare)
        put_uint32(bs, curve->fieldBytes);   /* string length field */
    for (size_t i = 0; i < curve->fieldBytes - 1; i++)
        put_byte(bs, mp_get_byte(y, i));
    put_byte(bs, (mp_get_byte(y, curve->fieldBytes - 1) & 0x7F) |
             (mp_get_bit(x, 0) << 7));

    mp_free(x);
    mp_free(y);
}